

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessDomainShaderArguments
          (ConversionStream *this,iterator *TypeToken,
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
          *Params,String *Globals,stringstream *ReturnHandlerSS,String *Prologue)

{
  StorageQualifier SVar1;
  InOutPatchType IVar2;
  pointer pSVar3;
  ShaderParameterInfo *pSVar4;
  pointer pSVar5;
  HLSL2GLSLConverterImpl *pHVar6;
  bool bVar7;
  iterator iVar8;
  ostream *poVar9;
  pointer pSVar10;
  const_iterator cVar11;
  char *__rhs;
  int iVar12;
  char *pcVar13;
  char *Prefix;
  char *pcVar14;
  ConversionStream *this_00;
  ShaderParameterInfo *NextMember;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  pointer pSVar16;
  int local_7b0;
  int local_7ac;
  String GLSLVariable;
  string msg;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  MemberStack_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> InputVarName;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  MemberStack;
  vector<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
  MemberItStack;
  String VarName;
  iterator Token;
  unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  Attributes;
  stringstream PrologueSS;
  ostream local_640 [376];
  stringstream InterfaceVarsOutSS;
  stringstream InterfaceVarsInSS;
  stringstream GlobalsSS;
  ostream local_1a8 [376];
  
  Token = (iterator)TypeToken->_M_node;
  Attributes._M_h._M_buckets = &Attributes._M_h._M_single_bucket;
  Attributes._M_h._M_bucket_count = 1;
  Attributes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  Attributes._M_h._M_element_count = 0;
  Attributes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  Attributes._M_h._M_rehash_policy._M_next_resize = 0;
  Attributes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ParseAttributesInComment((String *)&Token._M_node[3]._M_prev,&Attributes);
  ProcessShaderAttributes(this,&Token,&Attributes);
  std::__cxx11::stringstream::stringstream((stringstream *)&GlobalsSS);
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&PrologueSS,"domain",false);
  iVar8 = std::
          _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&Attributes._M_h,(key_type *)&PrologueSS);
  HashMapStringKey::Clear((HashMapStringKey *)&PrologueSS);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    LogError<true,char[40]>
              (false,"ProcessDomainShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xf15,(char (*) [40])"Domain shader misses \"domain\" attribute");
  }
  std::operator<<(local_1a8,"layout(");
  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)iVar8.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                   ._M_cur + 0x18);
  bVar7 = std::operator==(pbVar15,"tri");
  if (bVar7) {
    pcVar13 = "triangles";
LAB_001cdd6b:
    std::operator<<(local_1a8,pcVar13);
  }
  else {
    bVar7 = std::operator==(pbVar15,"quad");
    if (bVar7) {
      pcVar13 = "quads";
      goto LAB_001cdd6b;
    }
    bVar7 = std::operator==(pbVar15,"isoline");
    if (bVar7) {
      pcVar13 = "isolines";
      goto LAB_001cdd6b;
    }
    LogError<true,char[26],std::__cxx11::string,char[55]>
              (false,"ProcessDomainShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xf1f,(char (*) [26])"Unexpected domain value \"",pbVar15,
               (char (*) [55])"\". String constant \"tri\", \"quad\" or \"isoline\" expected");
  }
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&PrologueSS,"partitioning",false);
  iVar8 = std::
          _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&Attributes._M_h,(key_type *)&PrologueSS);
  HashMapStringKey::Clear((HashMapStringKey *)&PrologueSS);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    LogError<true,char[395]>
              (false,"ProcessDomainShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xf25,(char (*) [395])
                      "Undefined partitioning. In GLSL, partitioning is specified by the tessellation evaluation shader (domain shader) rather than by the tessellation control shader (hull shader)\nPlease use the following comment right above the function declaration to define partitioning and output topology:\n/* partitioning = {integer|fractional_even|fractional_odd}, outputtopology = {triangle_cw|triangle_ccw} */"
              );
  }
  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)iVar8.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                   ._M_cur + 0x18);
  bVar7 = std::operator==(pbVar15,"integer");
  pcVar13 = ", equal_spacing";
  if (bVar7) {
LAB_001cdec3:
    std::operator<<(local_1a8,pcVar13);
  }
  else {
    bVar7 = std::operator==(pbVar15,"fractional_even");
    if (bVar7) {
      pcVar13 = ", fractional_even_spacing";
      goto LAB_001cdec3;
    }
    bVar7 = std::operator==(pbVar15,"fractional_odd");
    if (bVar7) {
      pcVar13 = ", fractional_odd_spacing";
      goto LAB_001cdec3;
    }
    bVar7 = std::operator==(pbVar15,"pow2");
    if (bVar7) {
      FormatString<char[73]>
                ((string *)&PrologueSS,
                 (char (*) [73])
                 "pow2 partitioning is not supported by OpenGL. Using integer partitioning");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,_PrologueSS,0,0,0);
      }
      std::__cxx11::string::~string((string *)&PrologueSS);
      goto LAB_001cdec3;
    }
    LogError<true,char[26],std::__cxx11::string,char[86]>
              (false,"ProcessDomainShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xf33,(char (*) [26])"Unexpected partitioning \"",pbVar15,
               (char (*) [86])
               "\". String constant \"integer\", \"fractional_even\", \"fractional_odd\", or \"pow2\" expected"
              );
  }
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&PrologueSS,"outputtopology",false);
  iVar8 = std::
          _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&Attributes._M_h,(key_type *)&PrologueSS);
  HashMapStringKey::Clear((HashMapStringKey *)&PrologueSS);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    LogError<true,char[399]>
              (false,"ProcessDomainShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xf39,(char (*) [399])
                      "Undefined outputtopology. In GLSL, outputtopology is specified by the tessellation evaluation shader (domain shader) rather than by the tessellation control shader (hull shader)\nPlease use the following comment right above the function declaration to define partitioning and output topology:\n/* partitioning = {integer|fractional_even|fractional_odd}, outputtopology = {triangle_cw|triangle_ccw} */"
              );
  }
  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)iVar8.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                   ._M_cur + 0x18);
  bVar7 = std::operator==(pbVar15,"point");
  pcVar13 = "";
  if ((!bVar7) && (bVar7 = std::operator==(pbVar15,"line"), !bVar7)) {
    bVar7 = std::operator==(pbVar15,"triangle_cw");
    if (bVar7) {
      pcVar13 = ", cw";
    }
    else {
      bVar7 = std::operator==(pbVar15,"triangle_ccw");
      if (!bVar7) {
        LogError<true,char[22],std::__cxx11::string,char[78]>
                  (false,"ProcessDomainShaderArguments",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0xf44,(char (*) [22])"Unexpected topology \"",pbVar15,
                   (char (*) [78])
                   "\". String constant \"point\", \"line\", \"triangle_cw\", or \"triangle_ccw\" expected"
                  );
        goto LAB_001cdfa5;
      }
      pcVar13 = ", ccw";
    }
  }
  std::operator<<(local_1a8,pcVar13);
LAB_001cdfa5:
  std::operator<<(local_1a8,")in;\n");
  std::__cxx11::stringstream::stringstream((stringstream *)&PrologueSS);
  std::__cxx11::stringstream::stringstream((stringstream *)&InterfaceVarsInSS);
  std::__cxx11::stringstream::stringstream((stringstream *)&InterfaceVarsOutSS);
  pSVar16 = (Params->
            super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (Params->
           super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_7ac = 0;
  local_7b0 = 0;
  for (; pSVar16 != pSVar3; pSVar16 = pSVar16 + 1) {
    SVar1 = pSVar16->storageQualifier;
    if ((SVar1 == Ret) || (SVar1 == Out)) {
      MemberStack_1.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      MemberStack_1.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      MemberStack_1.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GLSLVariable._M_dataplus._M_p = (pointer)0x0;
      GLSLVariable._M_string_length = 0;
      GLSLVariable.field_2._M_allocated_capacity = 0;
      msg._M_dataplus._M_p = (pointer)pSVar16;
      std::
      vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
      ::emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                  *)&MemberStack_1,(ShaderParameterInfo **)&msg);
      msg._M_dataplus._M_p =
           (pointer)(pSVar16->members).
                    super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
      ::
      emplace_back<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                  *)&GLSLVariable,
                 (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                  *)&msg);
      if ((pSVar16->storageQualifier != Ret) &&
         (((pSVar16->GSAttribs).PrimType == Undefined &&
          ((pSVar16->HSAttribs).PatchType == Undefined)))) {
        poVar9 = std::operator<<(local_640,"    ");
        poVar9 = std::operator<<(poVar9,(pSVar16->Type)._M_dataplus._M_p);
        poVar9 = std::operator<<(poVar9,' ');
        std::operator<<(poVar9,(pSVar16->Name)._M_dataplus._M_p);
        if ((pSVar16->ArraySize)._M_string_length != 0) {
          poVar9 = std::operator<<(local_640,'[');
          poVar9 = std::operator<<(poVar9,(string *)&pSVar16->ArraySize);
          std::operator<<(poVar9,']');
        }
        std::operator<<(local_640,";\n");
      }
      while (MemberStack_1.
             super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             MemberStack_1.
             super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        pSVar4 = MemberStack_1.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1];
        pSVar5 = (pSVar4->members).
                 super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar10 = (pSVar4->members).
                  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pSVar5 == pSVar10) {
          if (*(pointer *)(GLSLVariable._M_string_length - 8) != pSVar5) {
            FormatString<char[26],char[49]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                       (char (*) [49])pSVar5);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb19);
            std::__cxx11::string::~string((string *)&msg);
          }
          if ((pSVar4->Semantic)._M_string_length == 0) {
            LogError<true,char[36],std::__cxx11::string,char[2]>
                      (false,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",&pSVar4->Name,
                       (char (*) [2])0x2dfbac);
          }
          InputVarName._M_dataplus._M_p = (pointer)&InputVarName.field_2;
          InputVarName._M_string_length = 0;
          InputVarName.field_2._M_local_buf[0] = '\0';
          pHVar6 = this->m_Converter;
          HashMapStringKey::HashMapStringKey
                    ((HashMapStringKey *)&msg,(pSVar4->Semantic)._M_dataplus._M_p,false);
          this_00 = (ConversionStream *)&msg;
          cVar11 = std::
                   _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(pHVar6->m_HLSLSemanticToGLSLVar)._M_elems[4]._M_elems[1]._M_h,
                          (key_type *)&msg);
          HashMapStringKey::Clear((HashMapStringKey *)&msg);
          if (cVar11.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              ._M_cur != (__node_type *)0x0) {
            this_00 = (ConversionStream *)
                      ((long)cVar11.
                             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                             ._M_cur + 0x18);
            std::__cxx11::string::_M_assign((string *)&InputVarName);
          }
          pcVar13 = "";
          if (pSVar4->storageQualifier == Ret) {
            pcVar13 = "_RET_VAL_";
          }
          BuildParameterName_abi_cxx11_((String *)&msg,this_00,&MemberStack_1,'.',"",pcVar13,"");
          if (InputVarName._M_string_length == 0) {
            pcVar13 = "_";
            if (this->m_bUseInOutLocationQualifiers != false) {
              pcVar13 = "_dsout_";
            }
            BuildParameterName_abi_cxx11_(&VarName,this_00,&MemberStack_1,'_',pcVar13,"","");
            bVar7 = this->m_bUseInOutLocationQualifiers;
            pcVar13 = GetInterpolationQualifier(this,pSVar4);
            iVar12 = -1;
            if (bVar7 != false) {
              iVar12 = local_7ac;
            }
            DefineInterfaceVar(iVar12,pcVar13,"out",&pSVar4->Type,&VarName,&InterfaceVarsOutSS);
            poVar9 = std::operator<<((ostream *)(ReturnHandlerSS + 0x10),(string *)&VarName);
            poVar9 = std::operator<<(poVar9," = ");
            poVar9 = std::operator<<(poVar9,(string *)&msg);
            std::operator<<(poVar9,";\\\n");
            local_7ac = local_7ac + (uint)bVar7;
            std::__cxx11::string::~string((string *)&VarName);
          }
          else {
            poVar9 = std::operator<<((ostream *)(ReturnHandlerSS + 0x10),(string *)&InputVarName);
            poVar9 = std::operator<<(poVar9,'(');
            poVar9 = std::operator<<(poVar9,(string *)&msg);
            std::operator<<(poVar9,");\\\n");
          }
          std::__cxx11::string::~string((string *)&msg);
          MemberStack_1.
          super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               MemberStack_1.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          GLSLVariable._M_string_length = GLSLVariable._M_string_length - 8;
          std::__cxx11::string::~string((string *)&InputVarName);
        }
        else {
          if ((pSVar4->Semantic)._M_string_length != 0) {
            LogError<true,char[35],std::__cxx11::string,char[2]>
                      (false,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar4->Name,
                       (char (*) [2])0x2dfbac);
            pSVar10 = (pSVar4->members).
                      super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          pSVar5 = *(pointer *)(GLSLVariable._M_string_length - 8);
          if (pSVar5 == pSVar10) {
            MemberStack_1.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 MemberStack_1.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            GLSLVariable._M_string_length = GLSLVariable._M_string_length - 8;
          }
          else {
            *(pointer *)(GLSLVariable._M_string_length - 8) = pSVar5 + 1;
            msg._M_dataplus._M_p = (pointer)pSVar5;
            std::
            vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
            ::
            emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                      ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                        *)&MemberStack_1,(ShaderParameterInfo **)&msg);
            msg._M_dataplus._M_p =
                 (pointer)(pSVar5->members).
                          super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            std::
            vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
            ::
            emplace_back<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                      ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                        *)&GLSLVariable,
                       (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                        *)&msg);
          }
        }
      }
      std::
      _Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ::~_Vector_base((_Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                       *)&GLSLVariable);
      std::
      _Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ::~_Vector_base((_Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                       *)&MemberStack_1);
    }
    else if (SVar1 == In) {
      IVar2 = (pSVar16->HSAttribs).PatchType;
      if (IVar2 == OutputPatch) {
        poVar9 = std::operator<<(local_640,"    const int _NumInputPoints = ");
        poVar9 = std::operator<<(poVar9,(string *)&pSVar16->ArraySize);
        std::operator<<(poVar9,";\n");
        poVar9 = std::operator<<(local_640,"    ");
        poVar9 = std::operator<<(poVar9,(string *)&pSVar16->Type);
        poVar9 = std::operator<<(poVar9,' ');
        poVar9 = std::operator<<(poVar9,(string *)&pSVar16->Name);
        std::operator<<(poVar9,"[_NumInputPoints];\n");
        std::operator<<(local_640,"    for(int i=0; i < gl_PatchVerticesIn; ++i)\n    {\n");
      }
      MemberStack.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      MemberStack.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      MemberStack.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      MemberItStack.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      msg._M_dataplus._M_p = (pointer)pSVar16;
      std::
      vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
      ::emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                  *)&MemberStack,(ShaderParameterInfo **)&msg);
      msg._M_dataplus._M_p =
           (pointer)(pSVar16->members).
                    super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
      ::
      emplace_back<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                  *)&MemberItStack,
                 (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                  *)&msg);
      if (((pSVar16->storageQualifier != Ret) && ((pSVar16->GSAttribs).PrimType == Undefined)) &&
         ((pSVar16->HSAttribs).PatchType == Undefined)) {
        poVar9 = std::operator<<(local_640,"    ");
        poVar9 = std::operator<<(poVar9,(pSVar16->Type)._M_dataplus._M_p);
        poVar9 = std::operator<<(poVar9,' ');
        std::operator<<(poVar9,(pSVar16->Name)._M_dataplus._M_p);
        if ((pSVar16->ArraySize)._M_string_length != 0) {
          poVar9 = std::operator<<(local_640,'[');
          poVar9 = std::operator<<(poVar9,(string *)&pSVar16->ArraySize);
          std::operator<<(poVar9,']');
        }
        std::operator<<(local_640,";\n");
      }
      pcVar13 = "";
      if (IVar2 == OutputPatch) {
        pcVar13 = "[i]";
      }
      __rhs = "";
      if (IVar2 == OutputPatch) {
        __rhs = "[]";
      }
      while (MemberStack.
             super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             MemberStack.
             super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        pSVar4 = MemberStack.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1];
        pSVar5 = (pSVar4->members).
                 super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar10 = (pSVar4->members).
                  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pSVar5 == pSVar10) {
          if (MemberItStack.
              super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current != pSVar5) {
            FormatString<char[26],char[49]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                       (char (*) [49])pSVar5);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb19);
            std::__cxx11::string::~string((string *)&msg);
          }
          if ((pSVar4->Semantic)._M_string_length == 0) {
            LogError<true,char[36],std::__cxx11::string,char[2]>
                      (false,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",&pSVar4->Name,
                       (char (*) [2])0x2dfbac);
          }
          GLSLVariable._M_dataplus._M_p = (pointer)&GLSLVariable.field_2;
          GLSLVariable._M_string_length = 0;
          GLSLVariable.field_2._M_allocated_capacity =
               GLSLVariable.field_2._M_allocated_capacity & 0xffffffffffffff00;
          pHVar6 = this->m_Converter;
          HashMapStringKey::HashMapStringKey
                    ((HashMapStringKey *)&msg,(pSVar4->Semantic)._M_dataplus._M_p,false);
          pcVar14 = (char *)&msg;
          cVar11 = std::
                   _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)((pHVar6->m_HLSLSemanticToGLSLVar)._M_elems + 4),(key_type *)&msg);
          HashMapStringKey::Clear((HashMapStringKey *)&msg);
          if (cVar11.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              ._M_cur != (__node_type *)0x0) {
            pcVar14 = (char *)((long)cVar11.
                                     super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                     ._M_cur + 0x18);
            std::__cxx11::string::_M_assign((string *)&GLSLVariable);
          }
          BuildParameterName_abi_cxx11_
                    ((String *)&msg,(ConversionStream *)pcVar14,&MemberStack,'.',"","",pcVar13);
          if (IVar2 == OutputPatch) {
            pcVar14 = "    ";
            std::operator<<(local_640,"    ");
          }
          if (GLSLVariable._M_string_length == 0) {
            Prefix = "_";
            if (this->m_bUseInOutLocationQualifiers != false) {
              Prefix = "_dsin_";
            }
            BuildParameterName_abi_cxx11_
                      (&VarName,(ConversionStream *)pcVar14,&MemberStack,'_',Prefix,"","");
            std::operator+(&InputVarName,&VarName,pcVar13);
            bVar7 = this->m_bUseInOutLocationQualifiers;
            iVar12 = -1;
            if (bVar7 != 0) {
              iVar12 = local_7b0;
            }
            pcVar14 = GetInterpolationQualifier(this,pSVar4);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &MemberStack_1,&VarName,__rhs);
            DefineInterfaceVar(iVar12,pcVar14,"in",&pSVar4->Type,(String *)&MemberStack_1,
                               &InterfaceVarsInSS);
            std::__cxx11::string::~string((string *)&MemberStack_1);
            InitVariable((String *)&msg,&InputVarName,&PrologueSS);
            local_7b0 = local_7b0 + (uint)bVar7;
            std::__cxx11::string::~string((string *)&InputVarName);
            std::__cxx11::string::~string((string *)&VarName);
          }
          else {
            poVar9 = std::operator<<(local_640,"    ");
            poVar9 = std::operator<<(poVar9,(string *)&GLSLVariable);
            poVar9 = std::operator<<(poVar9,'(');
            poVar9 = std::operator<<(poVar9,(string *)&msg);
            std::operator<<(poVar9,");\n");
          }
          std::__cxx11::string::~string((string *)&msg);
          MemberStack.
          super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               MemberStack.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          MemberItStack.
          super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               MemberItStack.
               super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          std::__cxx11::string::~string((string *)&GLSLVariable);
        }
        else {
          if ((pSVar4->Semantic)._M_string_length != 0) {
            LogError<true,char[35],std::__cxx11::string,char[2]>
                      (false,"ProcessShaderArgument",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar4->Name,
                       (char (*) [2])0x2dfbac);
            pSVar10 = (pSVar4->members).
                      super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          pSVar5 = MemberItStack.
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current;
          if (pSVar5 == pSVar10) {
            MemberStack.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 MemberStack.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            MemberItStack.
            super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 MemberItStack.
                 super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
          }
          else {
            MemberItStack.
            super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_current = pSVar5 + 1;
            msg._M_dataplus._M_p = (pointer)pSVar5;
            std::
            vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
            ::
            emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                      ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                        *)&MemberStack,(ShaderParameterInfo **)&msg);
            msg._M_dataplus._M_p =
                 (pointer)(pSVar5->members).
                          super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            std::
            vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
            ::
            emplace_back<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                      ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                        *)&MemberItStack,
                       (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                        *)&msg);
          }
        }
      }
      std::
      _Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
      ::~_Vector_base(&MemberItStack.
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
                     );
      std::
      _Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ::~_Vector_base(&MemberStack.
                       super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                     );
      if (IVar2 == OutputPatch) {
        std::operator<<(local_640,"    }\n");
      }
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)Prologue,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::operator+(&VarName,&InputVarName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&MemberStack_1
                );
  std::__cxx11::stringbuf::str();
  std::operator+(&msg,&VarName,&GLSLVariable);
  std::__cxx11::string::operator=((string *)Globals,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::~string((string *)&GLSLVariable);
  std::__cxx11::string::~string((string *)&VarName);
  std::__cxx11::string::~string((string *)&MemberStack_1);
  std::__cxx11::string::~string((string *)&InputVarName);
  std::__cxx11::stringstream::~stringstream((stringstream *)&InterfaceVarsOutSS);
  std::__cxx11::stringstream::~stringstream((stringstream *)&InterfaceVarsInSS);
  std::__cxx11::stringstream::~stringstream((stringstream *)&PrologueSS);
  std::__cxx11::stringstream::~stringstream((stringstream *)&GlobalsSS);
  std::
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&Attributes._M_h);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessDomainShaderArguments(TokenListType::iterator&          TypeToken,
                                                                            std::vector<ShaderParameterInfo>& Params,
                                                                            String&                           Globals,
                                                                            std::stringstream&                ReturnHandlerSS,
                                                                            String&                           Prologue)
{
    auto Token = TypeToken;
    // [domain("quad")]
    // DSOut main( HS_CONSTANT_DATA_OUTPUT input,
    // ^

    std::unordered_map<HashMapStringKey, String> Attributes;
    ParseAttributesInComment(TypeToken->Delimiter, Attributes);
    ProcessShaderAttributes(Token, Attributes);

    stringstream GlobalsSS;
    auto         DomainIt = Attributes.find("domain");
    if (DomainIt == Attributes.end())
        LOG_ERROR_AND_THROW("Domain shader misses \"domain\" attribute");

    GlobalsSS << "layout(";
    if (DomainIt->second == "tri")
        GlobalsSS << "triangles";
    else if (DomainIt->second == "quad")
        GlobalsSS << "quads";
    else if (DomainIt->second == "isoline")
        GlobalsSS << "isolines";
    else
        LOG_ERROR_AND_THROW("Unexpected domain value \"", DomainIt->second, "\". String constant \"tri\", \"quad\" or \"isoline\" expected");

    auto PartitioningIt = Attributes.find("partitioning");
    if (PartitioningIt == Attributes.end())
        LOG_ERROR_AND_THROW("Undefined partitioning. In GLSL, partitioning is specified by the tessellation evaluation shader (domain shader) rather than by the tessellation control shader (hull shader)\n"
                            "Please use the following comment right above the function declaration to define partitioning and output topology:\n"
                            "/* partitioning = {integer|fractional_even|fractional_odd}, outputtopology = {triangle_cw|triangle_ccw} */");

    if (PartitioningIt->second == "integer")
        GlobalsSS << ", equal_spacing";
    else if (PartitioningIt->second == "fractional_even")
        GlobalsSS << ", fractional_even_spacing";
    else if (PartitioningIt->second == "fractional_odd")
        GlobalsSS << ", fractional_odd_spacing";
    else if (PartitioningIt->second == "pow2")
    {
        LOG_WARNING_MESSAGE("pow2 partitioning is not supported by OpenGL. Using integer partitioning");
        GlobalsSS << ", equal_spacing";
    }
    else
        LOG_ERROR_AND_THROW("Unexpected partitioning \"", PartitioningIt->second, "\". String constant \"integer\", \"fractional_even\", \"fractional_odd\", or \"pow2\" expected");

    auto TopologyIt = Attributes.find("outputtopology");
    if (TopologyIt == Attributes.end())
        LOG_ERROR_AND_THROW("Undefined outputtopology. In GLSL, outputtopology is specified by the tessellation evaluation shader (domain shader) rather than by the tessellation control shader (hull shader)\n"
                            "Please use the following comment right above the function declaration to define partitioning and output topology:\n"
                            "/* partitioning = {integer|fractional_even|fractional_odd}, outputtopology = {triangle_cw|triangle_ccw} */");

    if (TopologyIt->second == "point")
        GlobalsSS << "";
    else if (TopologyIt->second == "line")
        GlobalsSS << "";
    else if (TopologyIt->second == "triangle_cw")
        GlobalsSS << ", cw";
    else if (TopologyIt->second == "triangle_ccw")
        GlobalsSS << ", ccw";
    else
        LOG_ERROR_AND_THROW("Unexpected topology \"", TopologyIt->second, "\". String constant \"point\", \"line\", \"triangle_cw\", or \"triangle_ccw\" expected");

    GlobalsSS << ")in;\n";

    std::stringstream PrologueSS, InterfaceVarsInSS, InterfaceVarsOutSS;
    int               inLocation = 0, outLocation = 0;
    for (const auto& TopLevelParam : Params)
    {
        if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            bool IsPatch = TopLevelParam.HSAttribs.PatchType == ShaderParameterInfo::HSAttributes::InOutPatchType::OutputPatch;
            if (IsPatch)
            {
                PrologueSS << "    const int _NumInputPoints = " << TopLevelParam.ArraySize << ";\n"; // gl_MaxPatchVertices
                PrologueSS << "    " << TopLevelParam.Type << ' ' << TopLevelParam.Name << "[_NumInputPoints];\n";
                // Iterate of the actual number of vertices in the input patch
                PrologueSS << "    for(int i=0; i < gl_PatchVerticesIn; ++i)\n    {\n";
            }

            ProcessShaderArgument(
                TopLevelParam, DSInd, InVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Getter) //
                {
                    // All inputs from vertex shaders to the TCS are aggregated into arrays, based on the size of the input patch.
                    // The size of these arrays is the number of input patches provided by the patch primitive.
                    // https://www.khronos.org/opengl/wiki/Tessellation_Control_Shader#Inputs
                    String FullIndexedParamName = BuildParameterName(MemberStack, '.', "", "", IsPatch ? "[i]" : "");
                    if (IsPatch)
                        PrologueSS << "    ";
                    if (Getter.empty())
                    {
                        auto VarName      = BuildParameterName(MemberStack, '_', m_bUseInOutLocationQualifiers ? "_dsin_" : "_");
                        auto InputVarName = VarName + (IsPatch ? "[i]" : "");
                        // User-defined inputs can be declared as unbounded arrays
                        DefineInterfaceVar(m_bUseInOutLocationQualifiers ? inLocation++ : -1,
                                           GetInterpolationQualifier(Param), "in",
                                           Param.Type, VarName + (IsPatch ? "[]" : ""), InterfaceVarsInSS);
                        InitVariable(FullIndexedParamName, InputVarName, PrologueSS);
                    }
                    else
                        PrologueSS << "    " << Getter << '(' << FullIndexedParamName << ");\n";
                } //
            );

            if (IsPatch)
            {
                PrologueSS << "    }\n";
            }
        }
        else if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Out ||
                 TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret)
        {
            ProcessShaderArgument(
                TopLevelParam, DSInd, OutVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Setter) //
                {
                    String SrcParamName = BuildParameterName(MemberStack, '.', "", Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret ? "_RET_VAL_" : "");
                    if (Setter.empty())
                    {
                        auto OutputVarName = BuildParameterName(MemberStack, '_', m_bUseInOutLocationQualifiers ? "_dsout_" : "_");
                        // Per-vertex outputs are aggregated into arrays.
                        // https://www.khronos.org/opengl/wiki/Tessellation_Control_Shader#Outputs
                        DefineInterfaceVar(m_bUseInOutLocationQualifiers ? outLocation++ : -1,
                                           GetInterpolationQualifier(Param), "out",
                                           Param.Type, OutputVarName, InterfaceVarsOutSS);
                        // A TCS can only ever write to the per-vertex output variable that corresponds to their invocation,
                        // so writes to per-vertex outputs must be of the form vertexTexCoord[gl_InvocationID]
                        ReturnHandlerSS << OutputVarName << " = " << SrcParamName << ";\\\n";
                    }
                    else
                        ReturnHandlerSS << Setter << '(' << SrcParamName << ");\\\n";
                } //
            );
        }
    }
    Prologue = PrologueSS.str();
    Globals  = GlobalsSS.str() + InterfaceVarsInSS.str() + InterfaceVarsOutSS.str();
}